

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

RepeatedField<unsigned_int> * __thiscall
google::protobuf::RepeatedField<unsigned_int>::operator=
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  int iVar1;
  void *pvVar2;
  void *__tmp;
  void **ppvVar3;
  void **ppvVar4;
  
  if (this != other) {
    pvVar2 = this->arena_or_elements_;
    ppvVar3 = (void **)((long)pvVar2 + -8);
    if (this->total_size_ == 0) {
      ppvVar3 = &this->arena_or_elements_;
    }
    ppvVar4 = (void **)((long)other->arena_or_elements_ + -8);
    if (other->total_size_ == 0) {
      ppvVar4 = &other->arena_or_elements_;
    }
    if (*ppvVar3 == *ppvVar4) {
      this->arena_or_elements_ = other->arena_or_elements_;
      other->arena_or_elements_ = pvVar2;
      iVar1 = this->current_size_;
      this->current_size_ = other->current_size_;
      other->current_size_ = iVar1;
      iVar1 = this->total_size_;
      this->total_size_ = other->total_size_;
      other->total_size_ = iVar1;
    }
    else {
      this->current_size_ = 0;
      if (other->current_size_ != 0) {
        Reserve(this,other->current_size_);
        this->current_size_ = this->current_size_ + other->current_size_;
        memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 2);
      }
    }
  }
  return this;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    RepeatedField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (this->GetArenaNoVirtual() != other.GetArenaNoVirtual()) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}